

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_rbtree.c
# Opt level: O1

RBTNode * rbt_leftmost(RBTree *rbt)

{
  RBTNode *pRVar1;
  RBTNode *pRVar2;
  
  pRVar2 = rbt->root;
  pRVar1 = pRVar2;
  if (pRVar2 != &g_sentinel) {
    do {
      pRVar2 = pRVar1;
      pRVar1 = pRVar2->left;
    } while (pRVar2->left != &g_sentinel);
  }
  pRVar1 = (RBTNode *)0x0;
  if (pRVar2 != &g_sentinel) {
    pRVar1 = pRVar2;
  }
  return pRVar1;
}

Assistant:

RBTNode *
rbt_leftmost(RBTree *rbt)
{
    RBTNode    *node = rbt->root;
    RBTNode    *leftmost = rbt->root;

    while (node != RBTNIL)
    {
        leftmost = node;
        node = node->left;
    }

    if (leftmost != RBTNIL)
        return leftmost;

    return NULL;
}